

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GdlExpression.h
# Opt level: O0

void __thiscall
GdlCondExpression::GdlCondExpression
          (GdlCondExpression *this,GdlExpression *pexpTest,GdlExpression *pexpTrue,
          GdlExpression *pexpFalse)

{
  bool bVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  undefined5 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc5;
  undefined1 in_stack_ffffffffffffffc6;
  undefined1 in_stack_ffffffffffffffc7;
  
  GdlExpression::GdlExpression
            ((GdlExpression *)
             CONCAT17(in_stack_ffffffffffffffc7,
                      CONCAT16(in_stack_ffffffffffffffc6,
                               CONCAT15(in_stack_ffffffffffffffc5,in_stack_ffffffffffffffc0))));
  *in_RDI = &PTR_Clone_0036b3e0;
  in_RDI[7] = in_RSI;
  in_RDI[8] = in_RDX;
  in_RDI[9] = in_RCX;
  if ((in_RDI[7] != 0) && (bVar1 = GdlObject::LineIsZero((GdlObject *)0x27d12e), bVar1)) {
    (**(code **)(*(long *)in_RDI[7] + 0x20))((long *)in_RDI[7],in_RDI + 1);
  }
  if ((in_RDI[8] != 0) && (bVar1 = GdlObject::LineIsZero((GdlObject *)0x27d193), bVar1)) {
    (**(code **)(*(long *)in_RDI[8] + 0x20))((long *)in_RDI[8],in_RDI + 1);
  }
  if ((in_RDI[9] != 0) && (bVar1 = GdlObject::LineIsZero((GdlObject *)0x27d1db), bVar1)) {
    (**(code **)(*(long *)in_RDI[9] + 0x20))((long *)in_RDI[9],in_RDI + 1);
  }
  return;
}

Assistant:

GdlCondExpression(
		GdlExpression* pexpTest,
		GdlExpression * pexpTrue,
		GdlExpression * pexpFalse)
		:	GdlExpression(),
			m_pexpTest(pexpTest),
			m_pexpTrue(pexpTrue),
			m_pexpFalse(pexpFalse)
	{
//		m_pexpTest->SetType(kexptBoolean);
		if (m_pexpTest && m_pexpTest->LineIsZero())
			m_pexpTest->PropagateLineAndFile(m_lnf);
		if (m_pexpTrue && m_pexpTrue->LineIsZero())
			m_pexpTrue->PropagateLineAndFile(m_lnf);
		if (m_pexpFalse && m_pexpFalse->LineIsZero())
			m_pexpFalse->PropagateLineAndFile(m_lnf);
	}